

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeDoubleRegStore(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t RegNo;
  uint32_t uVar3;
  uint32_t Val;
  DecodeStatus DVar4;
  MCInst *in_RCX;
  uint32_t in_ESI;
  uint pred;
  uint Rn;
  uint Rt;
  uint Rd;
  DecodeStatus S;
  void *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  RegNo = fieldFromInstruction_4(in_ESI,0,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x10,4);
  Val = fieldFromInstruction_4(in_ESI,0x1c,4);
  DVar4 = DecodeGPRnopcRegisterClass
                    ((MCInst *)CONCAT44(local_4,uVar2),RegNo,CONCAT44(Val,in_stack_ffffffffffffffc0)
                     ,in_stack_ffffffffffffffb8);
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
  if (_Var1) {
    if ((((uVar3 == 0xf) || (uVar2 == uVar3)) || (uVar2 == RegNo)) || (uVar2 == RegNo + 1)) {
      local_4 = MCDisassembler_SoftFail;
    }
    DVar4 = DecodeGPRPairRegisterClass
                      (in_RCX,local_4,CONCAT44(RegNo,uVar3),
                       (void *)CONCAT44(Val,in_stack_ffffffffffffffc0));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
    if (_Var1) {
      DVar4 = DecodeGPRRegisterClass
                        (in_RCX,local_4,CONCAT44(RegNo,uVar3),
                         (void *)CONCAT44(Val,in_stack_ffffffffffffffc0));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
      if (_Var1) {
        DVar4 = DecodePredicateOperand
                          ((MCInst *)CONCAT44(RegNo,uVar3),Val,(uint64_t)in_stack_ffffffffffffffb8,
                           (void *)0x29441b);
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
        if (!_Var1) {
          local_4 = MCDisassembler_Fail;
        }
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeDoubleRegStore(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;

	if (Rn == 0xF || Rd == Rn || Rd == Rt || Rd == Rt+1)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRPairRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}